

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cc
# Opt level: O0

bool __thiscall apollonia::Arbiter::operator==(Arbiter *this,Arbiter *other)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  const_reference other_00;
  ulong local_48;
  size_t i;
  ArbiterKey local_30;
  Arbiter *local_20;
  Arbiter *other_local;
  Arbiter *this_local;
  
  local_20 = other;
  other_local = this;
  ArbiterKey::ArbiterKey(&local_30,this);
  ArbiterKey::ArbiterKey((ArbiterKey *)&i,local_20);
  bVar1 = ArbiterKey::operator!=(&local_30,(ArbiterKey *)&i);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    for (local_48 = 0;
        sVar2 = std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::size
                          (&this->contacts_), local_48 < sVar2; local_48 = local_48 + 1) {
      this_00 = std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::operator[]
                          (&this->contacts_,local_48);
      other_00 = std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::operator[]
                           (&local_20->contacts_,local_48);
      bVar1 = Contact::operator!=(this_00,other_00);
      if (bVar1) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Arbiter::operator==(const Arbiter& other) const {
  if (ArbiterKey(*this) != ArbiterKey(other)) {
    return false;
  }
  for (size_t i = 0; i < contacts_.size(); ++i) {
    if (contacts_[i] != other.contacts_[i]) {
      return false;
    }
  }
  return true;
}